

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

void Cec_ManStartSimInfo(Vec_Ptr_t *vInfo,int nFlops)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  int local_28;
  int nWords;
  int w;
  int k;
  uint *pInfo;
  int nFlops_local;
  Vec_Ptr_t *vInfo_local;
  
  iVar1 = Vec_PtrReadWordsSimInfo(vInfo);
  iVar2 = Vec_PtrSize(vInfo);
  if (iVar2 < nFlops) {
    __assert_fail("nFlops <= Vec_PtrSize(vInfo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                  ,0x129,"void Cec_ManStartSimInfo(Vec_Ptr_t *, int)");
  }
  for (nWords = 0; iVar2 = nFlops, nWords < nFlops; nWords = nWords + 1) {
    pvVar4 = Vec_PtrEntry(vInfo,nWords);
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      *(undefined4 *)((long)pvVar4 + (long)local_28 * 4) = 0;
    }
  }
  while (nWords = iVar2, iVar2 = Vec_PtrSize(vInfo), nWords < iVar2) {
    pvVar4 = Vec_PtrEntry(vInfo,nWords);
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      uVar3 = Gia_ManRandom(0);
      *(uint *)((long)pvVar4 + (long)local_28 * 4) = uVar3;
    }
    iVar2 = nWords + 1;
  }
  return;
}

Assistant:

void Cec_ManStartSimInfo( Vec_Ptr_t * vInfo, int nFlops )
{
    unsigned * pInfo;
    int k, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    assert( nFlops <= Vec_PtrSize(vInfo) );
    for ( k = 0; k < nFlops; k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    for ( k = nFlops; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom( 0 );
    }
}